

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XIncludeUtils::doDOMNodeXInclude
          (XIncludeUtils *this,DOMNode *xincludeNode,DOMDocument *parsedDocument,
          XMLEntityHandler *entityResolver)

{
  XIncludeLocation XVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  long *plVar7;
  long *plVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  DOMNode *pDVar11;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  DOMAttr *pDVar12;
  long *plVar13;
  long *plVar14;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined8 uVar15;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  XMLCh *pXVar16;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  DOMNode *local_340;
  DOMNode *childNode_1;
  XMLSize_t i_3;
  DOMNode *newChild_1;
  DOMNode *newNode_1;
  DOMEntity *myEnt;
  DOMEntity *ent;
  XMLCh *entityName;
  DOMNotation *myNotation;
  DOMNotation *notat;
  XMLCh *notationName;
  DOMTypeInfo *typeInfo;
  DOMAttr *pAttributeNode_1;
  XMLSize_t i_2;
  XMLSize_t nSize_1;
  DOMNamedNodeMap *pAttributes_1;
  DOMNode *child_2;
  DOMDocumentFragment *frag_1;
  DOMNode *childNode;
  XMLSize_t i_1;
  DOMNode *newChild;
  XIncludeLocation xil;
  DOMNode *newNode;
  DOMNode *child_1;
  DOMDocumentFragment *frag;
  XMLUri includedURI;
  XMLUri parentURI;
  RefVectorOf<xercesc_4_0::DOMNode> delayedProcessing;
  DOMDocument *local_d8;
  DOMDocument *includedDoc;
  DOMText *includedText;
  XMLCh *includeBase;
  XIncludeLocation local_b0;
  XIncludeLocation relativeLocation;
  XIncludeLocation hrefLoc;
  DOMElement *fallback;
  DOMNode *child;
  XMLCh *attrNamespaceURI;
  XMLCh *attrName;
  DOMAttr *pAttributeNode;
  XMLSize_t i;
  XMLSize_t nSize;
  DOMNamedNodeMap *pAttributes;
  DOMNode *includeParent;
  XMLCh *encoding;
  XMLCh *xpointer;
  XMLCh *parse;
  XMLCh *href;
  bool modifiedNode;
  XMLEntityHandler *entityResolver_local;
  DOMDocument *parsedDocument_local;
  DOMNode *xincludeNode_local;
  XIncludeUtils *this_local;
  undefined4 extraout_var_00;
  
  parse = (XMLCh *)0x0;
  xpointer = (XMLCh *)0x0;
  encoding = (XMLCh *)0x0;
  includeParent = (DOMNode *)0x0;
  iVar4 = (*xincludeNode->_vptr_DOMNode[5])();
  pAttributes = (DOMNamedNodeMap *)CONCAT44(extraout_var,iVar4);
  uVar5 = (*xincludeNode->_vptr_DOMNode[0x1a])();
  if ((uVar5 & 1) != 0) {
    iVar4 = (*xincludeNode->_vptr_DOMNode[0xb])();
    plVar7 = (long *)CONCAT44(extraout_var_00,iVar4);
    pDVar12 = (DOMAttr *)(**(code **)(*plVar7 + 0x28))();
    for (pAttributeNode = (DOMAttr *)0x0; pAttributeNode < pDVar12;
        pAttributeNode = (DOMAttr *)((long)&(pAttributeNode->super_DOMNode)._vptr_DOMNode + 1)) {
      plVar8 = (long *)(**(code **)(*plVar7 + 0x18))(plVar7,pAttributeNode);
      pXVar9 = (XMLCh *)(**(code **)(*plVar8 + 0x140))();
      bVar2 = XMLString::equals(pXVar9,(XMLCh *)fgXIIncludeHREFAttrName);
      if (bVar2) {
        parse = (XMLCh *)(**(code **)(*plVar8 + 0x150))();
      }
      else {
        bVar2 = XMLString::equals(pXVar9,(XMLCh *)fgXIIncludeParseAttrName);
        if (bVar2) {
          xpointer = (XMLCh *)(**(code **)(*plVar8 + 0x150))();
        }
        else {
          bVar2 = XMLString::equals(pXVar9,(XMLCh *)fgXIIncludeXPointerAttrName);
          if (bVar2) {
            encoding = (XMLCh *)(**(code **)(*plVar8 + 0x150))();
          }
          else {
            bVar2 = XMLString::equals(pXVar9,(XMLCh *)fgXIIncludeEncodingAttrName);
            if (bVar2) {
              includeParent = (DOMNode *)(**(code **)(*plVar8 + 0x150))();
            }
            else {
              pXVar9 = (XMLCh *)(**(code **)(*plVar8 + 0xb0))();
              if (pXVar9 != (XMLCh *)0x0) {
                XMLString::equals(pXVar9,(XMLCh *)fgXIIIncludeNamespaceURI);
              }
            }
          }
        }
      }
    }
  }
  hrefLoc.fHref = (XMLCh *)0x0;
  iVar4 = (*xincludeNode->_vptr_DOMNode[7])();
  fallback = (DOMElement *)CONCAT44(extraout_var_01,iVar4);
  while (fallback != (DOMElement *)0x0) {
    iVar4 = (*(fallback->super_DOMNode)._vptr_DOMNode[4])();
    if (iVar4 == 1) {
      bVar2 = isXIFallbackDOMNode(&fallback->super_DOMNode);
      if (bVar2) {
        if (hrefLoc.fHref != (XMLCh *)0x0) {
          iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
          iVar6 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
          reportError(this,xincludeNode,XIncludeMultipleFallbackElems,
                      (XMLCh *)CONCAT44(extraout_var_02,iVar4),
                      (XMLCh *)CONCAT44(extraout_var_03,iVar6));
          return false;
        }
        hrefLoc.fHref = (XMLCh *)fallback;
      }
      else {
        bVar2 = isXIIncludeDOMNode(&fallback->super_DOMNode);
        if (bVar2) {
LAB_0044d471:
          iVar4 = (*(fallback->super_DOMNode)._vptr_DOMNode[2])();
          iVar6 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
          reportError(this,xincludeNode,XIncludeDisallowedChild,
                      (XMLCh *)CONCAT44(extraout_var_05,iVar4),
                      (XMLCh *)CONCAT44(extraout_var_06,iVar6));
          return false;
        }
        iVar4 = (*(fallback->super_DOMNode)._vptr_DOMNode[0x16])();
        bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_04,iVar4),
                                  (XMLCh *)fgXIIIncludeNamespaceURI);
        if (bVar2) goto LAB_0044d471;
      }
    }
    iVar4 = (*(fallback->super_DOMNode)._vptr_DOMNode[10])();
    fallback = (DOMElement *)CONCAT44(extraout_var_07,iVar4);
  }
  if (parse == (XMLCh *)0x0) {
    iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
    reportError(this,xincludeNode,XIncludeNoHref,(XMLCh *)0x0,
                (XMLCh *)CONCAT44(extraout_var_08,iVar4));
    return false;
  }
  if (xpointer == (XMLCh *)0x0) {
    xpointer = L"xml";
  }
  if (encoding != (XMLCh *)0x0) {
    reportError(this,xincludeNode,XIncludeXPointerNotSupported,(XMLCh *)0x0,parse);
    return false;
  }
  XIncludeLocation::XIncludeLocation(&relativeLocation,parse);
  XIncludeLocation::XIncludeLocation(&local_b0,parse);
  iVar4 = (*xincludeNode->_vptr_DOMNode[0x1f])();
  if ((XMLCh *)CONCAT44(extraout_var_09,iVar4) != (XMLCh *)0x0) {
    XIncludeLocation::prependPath(&relativeLocation,(XMLCh *)CONCAT44(extraout_var_09,iVar4));
  }
  pXVar9 = getBaseAttrValue(xincludeNode);
  if (pXVar9 != (XMLCh *)0x0) {
    pXVar9 = getBaseAttrValue(xincludeNode);
    XIncludeLocation::prependPath(&local_b0,pXVar9);
  }
  includedDoc = (DOMDocument *)0x0;
  local_d8 = (DOMDocument *)0x0;
  bVar2 = XMLString::equals(xpointer,L"xml");
  if (bVar2) {
    pXVar9 = XIncludeLocation::getLocation(&relativeLocation);
    pXVar10 = XIncludeLocation::getLocation(&local_b0);
    local_d8 = doXIncludeXMLFileDOM(this,pXVar9,pXVar10,xincludeNode,parsedDocument,entityResolver);
  }
  else {
    bVar2 = XMLString::equals(xpointer,(XMLCh *)fgXIIncludeParseAttrTextValue);
    if (!bVar2) {
      iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
      reportError(this,xincludeNode,XIncludeInvalidParseVal,xpointer,
                  (XMLCh *)CONCAT44(extraout_var_10,iVar4));
      this_local._7_1_ = false;
      goto LAB_0044eb04;
    }
    pXVar9 = XIncludeLocation::getLocation(&relativeLocation);
    pXVar10 = XIncludeLocation::getLocation(&local_b0);
    includedDoc = (DOMDocument *)
                  doXIncludeTEXTFileDOM
                            (this,pXVar9,pXVar10,(XMLCh *)includeParent,xincludeNode,parsedDocument,
                             entityResolver);
  }
  RefVectorOf<xercesc_4_0::DOMNode>::RefVectorOf
            ((RefVectorOf<xercesc_4_0::DOMNode> *)&parentURI.fMemoryManager,0xc,false,
             XMLPlatformUtils::fgMemoryManager);
  if ((local_d8 == (DOMDocument *)0x0) && (includedDoc == (DOMDocument *)0x0)) {
    pXVar9 = XIncludeLocation::getLocation(&relativeLocation);
    iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
    reportError(this,xincludeNode,XIncludeIncludeFailedResourceError,pXVar9,
                (XMLCh *)CONCAT44(extraout_var_11,iVar4));
    if (pAttributes == (DOMNamedNodeMap *)0x0) {
      local_340 = (DOMNode *)0x0;
      if (parsedDocument != (DOMDocument *)0x0) {
        local_340 = &parsedDocument->super_DOMNode;
      }
      pAttributes = (DOMNamedNodeMap *)local_340;
    }
    if (hrefLoc.fHref != (XMLCh *)0x0) {
      iVar4 = (*pAttributes->_vptr_DOMNamedNodeMap[0x1f])();
      XMLUri::XMLUri((XMLUri *)&includedURI.fMemoryManager,(XMLCh *)CONCAT44(extraout_var_12,iVar4),
                     XMLPlatformUtils::fgMemoryManager);
      pXVar9 = (XMLCh *)(**(code **)(*(long *)hrefLoc.fHref + 0xf8))();
      XMLUri::XMLUri((XMLUri *)&frag,pXVar9,XMLPlatformUtils::fgMemoryManager);
      bVar3 = (**(code **)(*(long *)hrefLoc.fHref + 0x90))();
      if ((bVar3 & 1) == 0) {
        (*pAttributes->_vptr_DOMNamedNodeMap[0x10])(pAttributes,xincludeNode);
      }
      else {
        iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
        plVar7 = (long *)CONCAT44(extraout_var_13,iVar4);
        newNode = (DOMNode *)(**(code **)(*(long *)hrefLoc.fHref + 0x38))();
        while (newNode != (DOMNode *)0x0) {
          iVar4 = (*newNode->_vptr_DOMNode[4])();
          if (iVar4 != 10) {
            iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xf])
                              (parsedDocument,newNode,1);
            xil.fHref = (XMLCh *)CONCAT44(extraout_var_14,iVar4);
            iVar4 = (**(code **)(*(long *)xil.fHref + 0x20))();
            if (iVar4 == 1) {
              pXVar9 = XMLUri::getPath((XMLUri *)&includedURI.fMemoryManager);
              pXVar10 = XMLUri::getPath((XMLUri *)&frag);
              bVar2 = XMLString::equals(pXVar9,pXVar10);
              if (!bVar2) {
                pXVar9 = getBaseAttrValue(xil.fHref);
                XVar1 = xil;
                if (pXVar9 == (XMLCh *)0x0) {
                  pDVar11 = (DOMNode *)(**(code **)(*(long *)hrefLoc.fHref + 0x28))();
                  pXVar9 = getBaseAttrValue(pDVar11);
                  (**(code **)(*(long *)XVar1.fHref + 0x160))(XVar1.fHref,fgXIBaseAttrName,pXVar9);
                }
                else {
                  pXVar9 = getBaseAttrValue(xil.fHref);
                  XIncludeLocation::XIncludeLocation((XIncludeLocation *)&newChild,pXVar9);
                  pDVar11 = (DOMNode *)(**(code **)(*(long *)hrefLoc.fHref + 0x28))();
                  pXVar9 = getBaseAttrValue(pDVar11);
                  if (pXVar9 != (XMLCh *)0x0) {
                    pDVar11 = (DOMNode *)(**(code **)(*(long *)hrefLoc.fHref + 0x28))();
                    pXVar9 = getBaseAttrValue(pDVar11);
                    XIncludeLocation::prependPath((XIncludeLocation *)&newChild,pXVar9);
                  }
                  XVar1.fHref = xil.fHref;
                  pXVar9 = XIncludeLocation::getLocation((XIncludeLocation *)&newChild);
                  (**(code **)(*(long *)XVar1.fHref + 0x160))(XVar1.fHref,fgXIBaseAttrName,pXVar9);
                  XIncludeLocation::~XIncludeLocation((XIncludeLocation *)&newChild);
                }
              }
            }
            pDVar11 = (DOMNode *)(**(code **)(*plVar7 + 0x88))(plVar7,xil.fHref);
            BaseRefVectorOf<xercesc_4_0::DOMNode>::addElement
                      ((BaseRefVectorOf<xercesc_4_0::DOMNode> *)&parentURI.fMemoryManager,pDVar11);
          }
          iVar4 = (*newNode->_vptr_DOMNode[10])();
          newNode = (DOMNode *)CONCAT44(extraout_var_15,iVar4);
        }
        (*pAttributes->_vptr_DOMNamedNodeMap[0xf])(pAttributes,plVar7,xincludeNode);
        (**(code **)(*plVar7 + 0x138))();
        for (childNode = (DOMNode *)0x0;
            pDVar11 = (DOMNode *)
                      BaseRefVectorOf<xercesc_4_0::DOMNode>::size
                                ((BaseRefVectorOf<xercesc_4_0::DOMNode> *)&parentURI.fMemoryManager)
            , childNode < pDVar11; childNode = (DOMNode *)((long)&childNode->_vptr_DOMNode + 1)) {
          pDVar11 = BaseRefVectorOf<xercesc_4_0::DOMNode>::elementAt
                              ((BaseRefVectorOf<xercesc_4_0::DOMNode> *)&parentURI.fMemoryManager,
                               (XMLSize_t)childNode);
          parseDOMNodeDoingXInclude(this,pDVar11,parsedDocument,entityResolver);
        }
      }
      href._7_1_ = true;
      XMLUri::~XMLUri((XMLUri *)&frag);
      XMLUri::~XMLUri((XMLUri *)&includedURI.fMemoryManager);
      goto LAB_0044eaad;
    }
    iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
    iVar6 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
    reportError(this,xincludeNode,XIncludeIncludeFailedNoFallback,
                (XMLCh *)CONCAT44(extraout_var_16,iVar4),(XMLCh *)CONCAT44(extraout_var_17,iVar6));
    this_local._7_1_ = false;
  }
  else {
    if (local_d8 == (DOMDocument *)0x0) {
      href._7_1_ = includedDoc != (DOMDocument *)0x0;
      if (href._7_1_) {
        (*pAttributes->_vptr_DOMNamedNodeMap[0xf])(pAttributes,includedDoc,xincludeNode);
      }
    }
    else {
      pXVar9 = XIncludeLocation::getLocation(&relativeLocation);
      addDocumentURIToCurrentInclusionHistoryStack(this,pXVar9);
      iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
      plVar7 = (long *)CONCAT44(extraout_var_18,iVar4);
      iVar4 = (*(local_d8->super_DOMNode)._vptr_DOMNode[7])(&local_d8->super_DOMNode);
      pAttributes_1 = (DOMNamedNodeMap *)CONCAT44(extraout_var_19,iVar4);
      while (pAttributes_1 != (DOMNamedNodeMap *)0x0) {
        iVar4 = (*pAttributes_1->_vptr_DOMNamedNodeMap[4])();
        if (iVar4 != 10) {
          iVar4 = (*pAttributes_1->_vptr_DOMNamedNodeMap[4])();
          if ((iVar4 == 1) &&
             (iVar4 = (*(local_d8->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])(),
             CONCAT44(extraout_var_20,iVar4) != 0)) {
            iVar4 = (*pAttributes_1->_vptr_DOMNamedNodeMap[0xb])();
            plVar8 = (long *)CONCAT44(extraout_var_21,iVar4);
            pDVar12 = (DOMAttr *)(**(code **)(*plVar8 + 0x28))();
            for (pAttributeNode_1 = (DOMAttr *)0x0; pAttributeNode_1 < pDVar12;
                pAttributeNode_1 =
                     (DOMAttr *)((long)&(pAttributeNode_1->super_DOMNode)._vptr_DOMNode + 1)) {
              plVar13 = (long *)(**(code **)(*plVar8 + 0x18))(plVar8,pAttributeNode_1);
              plVar14 = (long *)(**(code **)(*plVar13 + 0x170))();
              if (plVar14 != (long *)0x0) {
                pXVar9 = (XMLCh *)(**(code **)(*plVar14 + 0x18))();
                bVar2 = XMLString::equals(pXVar9,(XMLCh *)XMLUni::fgInfosetURIName);
                if (bVar2) {
                  pXVar9 = (XMLCh *)(**(code **)(*plVar14 + 0x10))();
                  bVar2 = XMLString::equals(pXVar9,(XMLCh *)XMLUni::fgNotationString);
                  if (bVar2) {
                    pXVar9 = (XMLCh *)(**(code **)(*plVar13 + 0x18))();
                    iVar4 = (*(local_d8->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])();
                    plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_22,iVar4) + 0x150)
                                      )();
                    plVar13 = (long *)(**(code **)(*plVar13 + 0x20))(plVar13,pXVar9);
                    iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])
                                      ();
                    if (CONCAT44(extraout_var_23,iVar4) == 0) {
                      iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd]
                              )();
                      uVar15 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar4) + 0x10))();
                      iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                [0x24])(parsedDocument,uVar15,0);
                      iVar6 = (*(parsedDocument->super_DOMNode)._vptr_DOMNode[7])
                                        (&parsedDocument->super_DOMNode);
                      (*(parsedDocument->super_DOMNode)._vptr_DOMNode[0xe])
                                (&parsedDocument->super_DOMNode,CONCAT44(extraout_var_25,iVar4),
                                 CONCAT44(extraout_var_26,iVar6));
                    }
                    iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])
                                      ();
                    plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_27,iVar4) + 0x150)
                                      )();
                    plVar14 = (long *)(**(code **)(*plVar14 + 0x20))(plVar14,pXVar9);
                    if (plVar14 == (long *)0x0) {
                      iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb]
                              )();
                      plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_28,iVar4) +
                                                    0x150))();
                      iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xf]
                              )(parsedDocument,plVar13,1);
                      (**(code **)(*plVar14 + 0x10))(plVar14,iVar4);
                    }
                    else {
                      pXVar10 = (XMLCh *)(**(code **)(*plVar14 + 0x140))();
                      pXVar16 = (XMLCh *)(**(code **)(*plVar13 + 0x140))();
                      bVar2 = XMLString::equals(pXVar10,pXVar16);
                      if (bVar2) {
                        pXVar10 = (XMLCh *)(**(code **)(*plVar14 + 0x148))();
                        pXVar16 = (XMLCh *)(**(code **)(*plVar13 + 0x148))();
                        bVar2 = XMLString::equals(pXVar10,pXVar16);
                        if (bVar2) {
                          pXVar10 = (XMLCh *)(**(code **)(*plVar14 + 0xf8))();
                          pXVar16 = (XMLCh *)(**(code **)(*plVar13 + 0xf8))();
                          bVar2 = XMLString::equals(pXVar10,pXVar16);
                          if (bVar2) goto LAB_0044e8da;
                        }
                      }
                      iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                [0x1a])();
                      reportError(this,xincludeNode,XIncludeConflictingNotation,pXVar9,
                                  (XMLCh *)CONCAT44(extraout_var_29,iVar4));
                    }
                  }
                  else {
                    pXVar9 = (XMLCh *)(**(code **)(*plVar14 + 0x10))();
                    bVar2 = XMLString::equals(pXVar9,(XMLCh *)XMLUni::fgEntityString);
                    if (bVar2) {
                      pXVar9 = (XMLCh *)(**(code **)(*plVar13 + 0x18))();
                      iVar4 = (*(local_d8->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])();
                      plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_30,iVar4) +
                                                    0x148))();
                      plVar13 = (long *)(**(code **)(*plVar13 + 0x20))(plVar13,pXVar9);
                      iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb]
                              )();
                      if (CONCAT44(extraout_var_31,iVar4) == 0) {
                        iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xd])();
                        uVar15 = (**(code **)(*(long *)CONCAT44(extraout_var_32,iVar4) + 0x10))();
                        iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0x24])(parsedDocument,uVar15,0);
                        iVar6 = (*(parsedDocument->super_DOMNode)._vptr_DOMNode[7])
                                          (&parsedDocument->super_DOMNode);
                        (*(parsedDocument->super_DOMNode)._vptr_DOMNode[0xe])
                                  (&parsedDocument->super_DOMNode,CONCAT44(extraout_var_33,iVar4),
                                   CONCAT44(extraout_var_34,iVar6));
                      }
                      iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb]
                              )();
                      plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_35,iVar4) +
                                                    0x148))();
                      plVar14 = (long *)(**(code **)(*plVar14 + 0x20))(plVar14,pXVar9);
                      if (plVar14 == (long *)0x0) {
                        iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xb])();
                        plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_36,iVar4) +
                                                      0x148))();
                        iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xf])(parsedDocument,plVar13,1);
                        (**(code **)(*plVar14 + 0x10))(plVar14,iVar4);
                      }
                      else {
                        pXVar10 = (XMLCh *)(**(code **)(*plVar14 + 0x140))();
                        pXVar16 = (XMLCh *)(**(code **)(*plVar13 + 0x140))();
                        bVar2 = XMLString::equals(pXVar10,pXVar16);
                        if (bVar2) {
                          pXVar10 = (XMLCh *)(**(code **)(*plVar14 + 0x148))();
                          pXVar16 = (XMLCh *)(**(code **)(*plVar13 + 0x148))();
                          bVar2 = XMLString::equals(pXVar10,pXVar16);
                          if (bVar2) {
                            pXVar10 = (XMLCh *)(**(code **)(*plVar14 + 0xf8))();
                            pXVar16 = (XMLCh *)(**(code **)(*plVar13 + 0xf8))();
                            bVar2 = XMLString::equals(pXVar10,pXVar16);
                            if (bVar2) goto LAB_0044e8da;
                          }
                        }
                        iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0x1a])();
                        reportError(this,xincludeNode,XIncludeConflictingEntity,pXVar9,
                                    (XMLCh *)CONCAT44(extraout_var_37,iVar4));
                      }
                    }
                  }
                }
              }
LAB_0044e8da:
            }
          }
          iVar4 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xf])
                            (parsedDocument,pAttributes_1,1);
          pDVar11 = (DOMNode *)(**(code **)(*plVar7 + 0x88))(plVar7,iVar4);
          BaseRefVectorOf<xercesc_4_0::DOMNode>::addElement
                    ((BaseRefVectorOf<xercesc_4_0::DOMNode> *)&parentURI.fMemoryManager,pDVar11);
        }
        iVar4 = (*pAttributes_1->_vptr_DOMNamedNodeMap[10])();
        pAttributes_1 = (DOMNamedNodeMap *)CONCAT44(extraout_var_38,iVar4);
      }
      (*pAttributes->_vptr_DOMNamedNodeMap[0xf])(pAttributes,plVar7,xincludeNode);
      (**(code **)(*plVar7 + 0x138))();
      for (childNode_1 = (DOMNode *)0x0;
          pDVar11 = (DOMNode *)
                    BaseRefVectorOf<xercesc_4_0::DOMNode>::size
                              ((BaseRefVectorOf<xercesc_4_0::DOMNode> *)&parentURI.fMemoryManager),
          childNode_1 < pDVar11; childNode_1 = (DOMNode *)((long)&childNode_1->_vptr_DOMNode + 1)) {
        pDVar11 = BaseRefVectorOf<xercesc_4_0::DOMNode>::elementAt
                            ((BaseRefVectorOf<xercesc_4_0::DOMNode> *)&parentURI.fMemoryManager,
                             (XMLSize_t)childNode_1);
        parseDOMNodeDoingXInclude(this,pDVar11,parsedDocument,entityResolver);
      }
      popFromCurrentInclusionHistoryStack(this,(XMLCh *)0x0);
      href._7_1_ = true;
    }
LAB_0044eaad:
    if (local_d8 != (DOMDocument *)0x0) {
      (*(local_d8->super_DOMNode)._vptr_DOMNode[0x27])(&local_d8->super_DOMNode);
    }
    this_local._7_1_ = href._7_1_;
  }
  RefVectorOf<xercesc_4_0::DOMNode>::~RefVectorOf
            ((RefVectorOf<xercesc_4_0::DOMNode> *)&parentURI.fMemoryManager);
LAB_0044eb04:
  XIncludeLocation::~XIncludeLocation(&local_b0);
  XIncludeLocation::~XIncludeLocation(&relativeLocation);
  return this_local._7_1_;
}

Assistant:

bool
XIncludeUtils::doDOMNodeXInclude(DOMNode *xincludeNode, DOMDocument *parsedDocument, XMLEntityHandler* entityResolver){
    bool modifiedNode = false;
    /* the relevant attributes to look for */
    const XMLCh *href = NULL;
    const XMLCh *parse = NULL;
    const XMLCh *xpointer = NULL;
    const XMLCh *encoding = NULL;
//    const XMLCh *accept = NULL;
//    const XMLCh *acceptlanguage = NULL;
    DOMNode *includeParent = xincludeNode->getParentNode();


    if(xincludeNode->hasAttributes()) {
        /* get all the attributes of the node */
        DOMNamedNodeMap *pAttributes = xincludeNode->getAttributes();
        XMLSize_t nSize = pAttributes->getLength();
        for(XMLSize_t i=0;i<nSize;++i) {
            DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
            const XMLCh *attrName = pAttributeNode->getName();
            /* check each attribute against the potential useful names */
            if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeHREFAttrName)){
                href = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeParseAttrName)){
                parse = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeXPointerAttrName)){
                xpointer = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeEncodingAttrName)){
                encoding = pAttributeNode->getValue();
//            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeAcceptAttrName)){
//                accept = pAttributeNode->getValue();
//            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeAcceptLanguageAttrName)){
//                acceptlanguage = pAttributeNode->getValue();
            } else {
                /* if any other attribute is in the xi namespace, it's an error */
                const XMLCh *attrNamespaceURI = pAttributeNode->getNamespaceURI();
                if (attrNamespaceURI && XMLString::equals(attrNamespaceURI, XIncludeUtils::fgXIIIncludeNamespaceURI)){
                } else {
                    /* ignore - any other attribute is allowed according to spec,
                       and must be ignored */
                }
            }
        }
    }
    // 3.1 xi:include Element
    // The children property of the xi:include element may include a single xi:fallback element;
    // the appearance of more than one xi:fallback element, an xi:include element,
    // or any other element from the XInclude namespace is a fatal error.
    DOMNode *child;
    DOMElement *fallback = NULL;
    for (child = xincludeNode->getFirstChild(); child != 0; child=child->getNextSibling()){
        if(child->getNodeType()!=DOMNode::ELEMENT_NODE)
            continue;
        if ( isXIFallbackDOMNode(child) ){
            if (fallback != NULL){
                /* fatal error - there are more than one fallback children */
                XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeMultipleFallbackElems,
                    parsedDocument->getDocumentURI(), parsedDocument->getDocumentURI());
                return false;
            }
            fallback = (DOMElement*)child;
        }
        else if(isXIIncludeDOMNode(child) || XMLString::equals(child->getNamespaceURI(), XIncludeUtils::fgXIIIncludeNamespaceURI)) {
            /* fatal error - an xi element different from xi:fallback is a child of xi:include */
            XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeDisallowedChild,
                child->getNodeName(), parsedDocument->getDocumentURI());
            return false;
        }
    }

    if (href == NULL){
        /* this is an unrecoverable error until we have xpointer support -
           if there is an xpointer, the current document is assumed
           however, there is no xpointer support yet */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeNoHref,
            NULL, parsedDocument->getDocumentURI());
        return false;
    }

    /* set up the accept and accept-language values */
//    if (accept != NULL){
//
//    }

    if (parse == NULL){
        /* use the default, as specified */
        parse = XIncludeUtils::fgXIIncludeParseAttrXMLValue;
    }

    if (xpointer != NULL){
        /* not supported yet */
        /* Note that finding an xpointer attr along with parse="text" is a Fatal Error
         *  - http://www.w3.org/TR/xinclude/#include-location */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeXPointerNotSupported,
            NULL, href);
        return false;
    }

    /* set up the href according to what has gone before */
    XIncludeLocation hrefLoc(href);
    XIncludeLocation relativeLocation(href);
    const XMLCh *includeBase = xincludeNode->getBaseURI();
    if (includeBase != NULL){
        hrefLoc.prependPath(includeBase);
    }

    if (getBaseAttrValue(xincludeNode) != NULL){
        relativeLocation.prependPath(getBaseAttrValue(xincludeNode));
    }

    /*  Take the relevant action - we need to retrieve the target as a whole before
        we can know if it was successful or not, therefore the do* methods do
        not modify the parsedDocument. Swapping the results in is left to the
        caller (i.e. here) */
    DOMText *includedText = NULL;
    DOMDocument *includedDoc = NULL;
    if (XMLString::equals(parse, XIncludeUtils::fgXIIncludeParseAttrXMLValue)){
        /* including a XML element */
        includedDoc = doXIncludeXMLFileDOM(hrefLoc.getLocation(), relativeLocation.getLocation(), xincludeNode, parsedDocument, entityResolver);
    } else if (XMLString::equals(parse, XIncludeUtils::fgXIIncludeParseAttrTextValue)){
        /* including a text value */
        includedText = doXIncludeTEXTFileDOM(hrefLoc.getLocation(), relativeLocation.getLocation(), encoding, xincludeNode, parsedDocument, entityResolver);
    } else {
        /* invalid parse attribute value - fatal error according to the specification */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeInvalidParseVal,
            parse, parsedDocument->getDocumentURI());
        return false;
    }

    RefVectorOf<DOMNode> delayedProcessing(12,false);
    if (includedDoc == NULL && includedText == NULL){
        /* there was an error - this is now a resource error
           let's see if there is a fallback */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeIncludeFailedResourceError,
            hrefLoc.getLocation(), parsedDocument->getDocumentURI());

        if (includeParent == NULL){
            includeParent = parsedDocument;
        }

        // we could be getting errors trying to insert elements at the root of the document, so we should use replaceChild;
        // in order to handle multiple nodes, add them to a document fragment and use that to replace the original node
        if (fallback){
            /* baseURI fixups - see http://www.w3.org/TR/xinclude/#base for details. */
            XMLUri parentURI(includeParent->getBaseURI());
            XMLUri includedURI(fallback->getBaseURI());

            if (fallback->hasChildNodes()){
                DOMDocumentFragment* frag = parsedDocument->createDocumentFragment();
                DOMNode *child = fallback->getFirstChild();
                /* add the content of the fallback element, and remove the fallback elem itself */
                for ( ; child != NULL ; child=child->getNextSibling()){
                    if (child->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE){
                        continue;
                    }
                    DOMNode *newNode = parsedDocument->importNode(child, true);
                    /* if the paths differ we need to add a base attribute */
                    if (newNode->getNodeType()==DOMNode::ELEMENT_NODE && !XMLString::equals(parentURI.getPath(), includedURI.getPath())){
                        if (getBaseAttrValue(newNode) == NULL){
                            /* need to calculate the proper path difference to get the relativePath */
                            ((DOMElement*)newNode)->setAttribute(fgXIBaseAttrName, getBaseAttrValue(fallback->getParentNode()));
                        } else {
                            /* the included node has base of its own which takes precedence */
                            XIncludeLocation xil(getBaseAttrValue(newNode));
                            if (getBaseAttrValue(fallback->getParentNode()) != NULL){
                                /* prepend any specific base modification of the xinclude node */
                                xil.prependPath(getBaseAttrValue(fallback->getParentNode()));
                            }
                            ((DOMElement*)newNode)->setAttribute(fgXIBaseAttrName, xil.getLocation());
                        }
                    }
                    DOMNode *newChild = frag->appendChild(newNode);
                    // don't process the node now, wait until it is placed in the final position
                    delayedProcessing.addElement(newChild);
                    //parseDOMNodeDoingXInclude(newChild, parsedDocument, entityResolver);
                }
                includeParent->replaceChild(frag, xincludeNode);
                frag->release();

                for(XMLSize_t i=0;i<delayedProcessing.size();i++)
                {
                    DOMNode* childNode=delayedProcessing.elementAt(i);
                    parseDOMNodeDoingXInclude(childNode, parsedDocument, entityResolver);
                }
                modifiedNode = true;
            } else {
                /* empty fallback element - simply remove it! */
                includeParent->removeChild(xincludeNode);
                modifiedNode = true;
            }
        } else {
            XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeIncludeFailedNoFallback,
                parsedDocument->getDocumentURI(), parsedDocument->getDocumentURI());
            return false;
        }
    } else {
        if (includedDoc){
            /* record the successful include while we process the children */
            addDocumentURIToCurrentInclusionHistoryStack(hrefLoc.getLocation());

            DOMDocumentFragment* frag = parsedDocument->createDocumentFragment();
            /* need to import the document prolog here */
            DOMNode *child = includedDoc->getFirstChild();
            for (; child != NULL; child = child->getNextSibling()) {
                if (child->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE)
                    continue;
                // check for NOTATION or ENTITY clash
                if(child->getNodeType()==DOMNode::ELEMENT_NODE && includedDoc->getDoctype()!=NULL) {
                    DOMNamedNodeMap *pAttributes = child->getAttributes();
                    XMLSize_t nSize = pAttributes->getLength();
                    for(XMLSize_t i=0;i<nSize;++i) {
                        DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                        const DOMTypeInfo * typeInfo=pAttributeNode->getSchemaTypeInfo();
                        if(typeInfo && XMLString::equals(typeInfo->getTypeNamespace(), XMLUni::fgInfosetURIName)) {
                            if(XMLString::equals(typeInfo->getTypeName(), XMLUni::fgNotationString)) {
                                const XMLCh* notationName=pAttributeNode->getNodeValue();
                                DOMNotation* notat=(DOMNotation*)includedDoc->getDoctype()->getNotations()->getNamedItem(notationName);
                                // ensure we have a DTD
                                if(parsedDocument->getDoctype()==NULL)
                                    parsedDocument->insertBefore(parsedDocument->createDocumentType(parsedDocument->getDocumentElement()->getNodeName(), NULL,NULL), parsedDocument->getFirstChild());
                                DOMNotation* myNotation=(DOMNotation*)parsedDocument->getDoctype()->getNotations()->getNamedItem(notationName);
                                if(myNotation==NULL)
                                {
                                    // it's missing, add it
                                    parsedDocument->getDoctype()->getNotations()->setNamedItem(parsedDocument->importNode(notat, true));
                                }
                                else if(XMLString::equals(myNotation->getPublicId(), notat->getPublicId()) &&
                                        XMLString::equals(myNotation->getSystemId(), notat->getSystemId()) &&
                                        XMLString::equals(myNotation->getBaseURI(), notat->getBaseURI()))
                                {
                                    // it's duplicate, ignore it
                                }
                                else
                                {
                                    // it's a conflict, report it
                                    XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeConflictingNotation,
                                        notationName, parsedDocument->getDocumentURI());
                                }
                            }
                            else if(XMLString::equals(typeInfo->getTypeName(), XMLUni::fgEntityString)) {
                                const XMLCh* entityName=pAttributeNode->getNodeValue();
                                DOMEntity* ent=(DOMEntity*)includedDoc->getDoctype()->getEntities()->getNamedItem(entityName);
                                // ensure we have a DTD
                                if(parsedDocument->getDoctype()==NULL)
                                    parsedDocument->insertBefore(parsedDocument->createDocumentType(parsedDocument->getDocumentElement()->getNodeName(), NULL,NULL), parsedDocument->getFirstChild());
                                DOMEntity* myEnt=(DOMEntity*)parsedDocument->getDoctype()->getEntities()->getNamedItem(entityName);
                                if(myEnt==NULL)
                                {
                                    // it's missing, add it
                                    parsedDocument->getDoctype()->getEntities()->setNamedItem(parsedDocument->importNode(ent, true));
                                }
                                else if(XMLString::equals(myEnt->getPublicId(), ent->getPublicId()) &&
                                        XMLString::equals(myEnt->getSystemId(), ent->getSystemId()) &&
                                        XMLString::equals(myEnt->getBaseURI(), ent->getBaseURI()))
                                {
                                    // it's duplicate, ignore it
                                }
                                else
                                {
                                    // it's a conflict, report it
                                    XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeConflictingEntity,
                                        entityName, parsedDocument->getDocumentURI());
                                }
                            }
                        }
                    }
                }
                DOMNode *newNode = parsedDocument->importNode(child, true);
                DOMNode *newChild = frag->appendChild(newNode);
                // don't process the node now, wait until it is placed in the final position
                delayedProcessing.addElement(newChild);
                //parseDOMNodeDoingXInclude(newChild, parsedDocument, entityResolver);
            }
            includeParent->replaceChild(frag, xincludeNode);
            frag->release();

            for(XMLSize_t i=0;i<delayedProcessing.size();i++)
            {
                DOMNode* childNode=delayedProcessing.elementAt(i);
                parseDOMNodeDoingXInclude(childNode, parsedDocument, entityResolver);
            }
            popFromCurrentInclusionHistoryStack(NULL);
            modifiedNode = true;
        } else if (includedText){
            includeParent->replaceChild(includedText, xincludeNode);
            modifiedNode = true;
        }
    }

    if (includedDoc)
        includedDoc->release();

    return modifiedNode;
}